

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3MatchinfoFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  byte bVar1;
  sqlite_int64 iValue;
  Fts3Cursor *pFVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  size_t sVar7;
  size_t sVar8;
  MatchinfoBuffer *pMVar9;
  u8 *__dest;
  char *pBuf;
  LcsIterator *__s;
  ulong uVar10;
  LcsIterator *pLVar11;
  uint uVar12;
  LcsIterator *pIter;
  Fts3Cursor **ppCsr;
  LcsIterator *pLVar13;
  int iVar14;
  int nLive;
  _func_void_void_ptr *p_Var15;
  ulong uVar16;
  sqlite3_stmt *psVar17;
  Fts3Cursor *pCsr_00;
  Fts3Expr *pFVar18;
  LcsIterator *pIter_00;
  long lVar19;
  byte *__s2;
  int iCol;
  char **ppOut;
  long lVar20;
  bool bVar21;
  int local_d0;
  undefined4 local_cc;
  int nPhrase;
  Fts3Cursor *local_c0;
  MatchInfo local_b8;
  byte *local_90;
  u8 *local_88;
  sqlite3_context *local_80;
  Fts3Table *local_78;
  Fts3Table *local_70;
  sqlite3_stmt *pSelect;
  _func_void_void_ptr *local_60;
  long local_58;
  char *a;
  char **local_48;
  Fts3Cursor *pCsr;
  sqlite3_int64 nToken;
  
  ppCsr = &pCsr;
  iVar3 = fts3FunctionArg(pContext,"matchinfo",*apVal,ppCsr);
  if (iVar3 != 0) {
    return;
  }
  if (nVal < 2) {
    pbVar6 = (byte *)0x0;
  }
  else {
    pbVar6 = sqlite3_value_text(apVal[1]);
  }
  pFVar18 = pCsr->pExpr;
  __s2 = (byte *)"pcx";
  if (pbVar6 != (byte *)0x0) {
    __s2 = pbVar6;
  }
  if (pFVar18 == (Fts3Expr *)0x0) {
    sqlite3_result_blob(pContext,"",0,(_func_void_void_ptr *)0x0);
    return;
  }
  local_70 = (Fts3Table *)(pCsr->base).pVtab;
  local_b8.flag = '\0';
  local_b8._25_7_ = 0;
  local_b8.aMatchinfo = (u32 *)0x0;
  local_b8.nDoc = 0;
  local_b8.pCursor = pCsr;
  local_b8.nCol = local_70->nColumn;
  local_b8.nPhrase = 0;
  pMVar9 = pCsr->pMIBuffer;
  iVar3 = 7;
  local_80 = pContext;
  if (pMVar9 == (MatchinfoBuffer *)0x0) {
LAB_001ad893:
    _nPhrase = (sqlite3_stmt *)((ulong)_nPhrase & 0xffffffff00000000);
    fts3ExprIterate(pFVar18,fts3ExprPhraseCountCb,&nPhrase);
    local_c0 = pCsr;
    pCsr->nPhrase = nPhrase;
    local_b8.nPhrase = nPhrase;
    lVar19 = 0;
    for (pbVar6 = __s2; bVar1 = *pbVar6, bVar1 != 0; pbVar6 = pbVar6 + 1) {
      _nPhrase = (sqlite3_stmt *)0x0;
      uVar12 = bVar1 - 0x62;
      if (0x17 < uVar12) {
LAB_001ad8f6:
        if (bVar1 == 0x61) {
LAB_001ad8ff:
          if (local_70->bFts4 != '\0') goto LAB_001ad924;
        }
LAB_001ada5e:
        sqlite3Fts3ErrMsg((char **)&nPhrase,"unrecognized matchinfo request: %c");
        psVar17 = _nPhrase;
        sqlite3_result_error(local_80,(char *)_nPhrase,-1);
        sqlite3_free(psVar17);
        goto LAB_001ae09e;
      }
      if ((0xc24003U >> (uVar12 & 0x1f) & 1) == 0) {
        if (uVar12 != 10) {
          if (uVar12 != 0xc) goto LAB_001ad8f6;
          goto LAB_001ad8ff;
        }
        if (local_70->bHasDocsize == '\0') goto LAB_001ada5e;
      }
LAB_001ad924:
      sVar7 = fts3MatchinfoSize(&local_b8,bVar1);
      lVar19 = lVar19 + sVar7;
    }
    sVar8 = strlen((char *)__s2);
    pMVar9 = (MatchinfoBuffer *)sqlite3_malloc64(sVar8 + lVar19 * 8 + 0x25);
    if (pMVar9 != (MatchinfoBuffer *)0x0) {
      memset(pMVar9,0,lVar19 * 8 + 0x24);
      pMVar9->aMatchinfo[0] = 0x1c;
      pMVar9->aMatchinfo[lVar19 + 1] = (int)((lVar19 << 0x20) + 0x100000000U >> 0x1e) + 0x1c;
      pMVar9->nElem = (int)lVar19;
      pMVar9->zMatchinfo = (char *)(pMVar9[1].aRef + lVar19 * 8 + 4);
      memcpy(pMVar9[1].aRef + lVar19 * 8 + 4,__s2,sVar8 + 1);
      pMVar9->aRef[0] = '\x01';
      local_c0->pMIBuffer = pMVar9;
      local_c0->isMatchinfoNeeded = 1;
      local_cc = 0;
      pCsr_00 = local_c0;
      goto LAB_001ad9f2;
    }
    local_c0->pMIBuffer = (MatchinfoBuffer *)0x0;
    local_c0->isMatchinfoNeeded = 1;
LAB_001adab2:
    local_88 = (u8 *)0x0;
    p_Var15 = (_func_void_void_ptr *)0x0;
  }
  else {
    iVar4 = strcmp(pMVar9->zMatchinfo,(char *)__s2);
    if (iVar4 != 0) {
      sqlite3Fts3MIBufferFree(pMVar9);
      pCsr->pMIBuffer = (MatchinfoBuffer *)0x0;
      pFVar18 = pCsr->pExpr;
      goto LAB_001ad893;
    }
    local_cc = (undefined4)CONCAT71((int7)((ulong)ppCsr >> 8),1);
    pCsr_00 = pCsr;
LAB_001ad9f2:
    local_60 = fts3MIBufferFree;
    if (pMVar9->aRef[1] == '\0') {
      pMVar9->aRef[1] = '\x01';
      __dest = &pMVar9->field_0x1c;
    }
    else if (pMVar9->aRef[2] == '\0') {
      pMVar9->aRef[2] = '\x01';
      __dest = pMVar9[1].aRef + (long)pMVar9->nElem * 4;
    }
    else {
      __dest = (u8 *)sqlite3_malloc64((long)pMVar9->nElem << 2);
      if (__dest == (u8 *)0x0) goto LAB_001adab2;
      local_60 = sqlite3_free;
      if (pMVar9->bGlobal != 0) {
        memcpy(__dest,&pMVar9->field_0x1c,(long)pMVar9->nElem << 2);
      }
    }
    local_b8.nPhrase = pCsr_00->nPhrase;
    local_78 = (Fts3Table *)(pCsr_00->base).pVtab;
    pSelect = (sqlite3_stmt *)0x0;
    iVar3 = 0;
    local_c0 = (Fts3Cursor *)0x0;
    local_90 = __s2;
    local_88 = __dest;
    while ((local_b8.aMatchinfo = (u32 *)__dest, iVar3 == 0 &&
           (bVar1 = __s2[(long)local_c0], bVar1 != 0))) {
      local_b8.flag = bVar1;
      switch(bVar1) {
      case 0x6c:
        iValue = pCsr_00->iPrevId;
        _nPhrase = (sqlite3_stmt *)0x0;
        iVar3 = fts3SqlStmt(local_78,0x15,(sqlite3_stmt **)&nPhrase,(sqlite3_value **)0x0);
        psVar17 = _nPhrase;
        if (iVar3 == 0) {
          sqlite3_bind_int64(_nPhrase,1,iValue);
          iVar3 = sqlite3_step(psVar17);
          if ((iVar3 == 100) && (iVar3 = sqlite3_column_type(psVar17,0), iVar3 == 4)) {
            local_d0 = 0;
            pBuf = (char *)sqlite3_column_blob(psVar17,0);
            for (lVar19 = 0; iVar3 = local_d0, lVar19 < local_b8.nCol; lVar19 = lVar19 + 1) {
              iVar3 = sqlite3Fts3GetVarint(pBuf,(sqlite_int64 *)&nPhrase);
              pBuf = pBuf + iVar3;
              *(int *)((long)local_b8.aMatchinfo + lVar19 * 4) = nPhrase;
            }
          }
          else {
            iVar3 = sqlite3_reset(psVar17);
            if (iVar3 == 0) {
              iVar3 = 0x10b;
            }
            psVar17 = (sqlite3_stmt *)0x0;
          }
        }
        local_d0 = iVar3;
        sqlite3_reset(psVar17);
        iVar4 = local_d0;
        iVar3 = local_d0;
        break;
      case 0x6d:
      case 0x6f:
      case 0x71:
      case 0x72:
switchD_001adba4_caseD_6d:
        pFVar18 = pCsr_00->pExpr;
        local_d0 = fts3ExprLoadDoclists(pCsr_00,(int *)0x0,(int *)0x0);
        iVar4 = local_d0;
        iVar3 = local_d0;
        if (local_d0 == 0) {
          if ((char)local_cc != '\0') {
LAB_001adc6d:
            fts3ExprIterate(pFVar18,fts3ExprLocalHitsCb,&local_b8);
            goto LAB_001adcf7;
          }
          iVar4 = 0;
          if ((pCsr_00->pDeferred == (Fts3DeferredToken *)0x0) ||
             (iVar4 = fts3MatchinfoSelectDoctotal(local_78,&pSelect,&local_b8.nDoc,(char **)0x0),
             iVar3 = iVar4, iVar4 == 0)) {
            local_d0 = iVar4;
            local_d0 = fts3ExprIterate(pFVar18,fts3ExprGlobalHitsCb,&local_b8);
            sqlite3Fts3EvalTestDeferred(pCsr_00,&local_d0);
            iVar4 = local_d0;
            iVar3 = local_d0;
            if (local_d0 == 0) goto LAB_001adc6d;
          }
        }
        break;
      case 0x6e:
        if ((char)local_cc == '\0') {
          _nPhrase = (sqlite3_stmt *)0x0;
          iVar4 = fts3MatchinfoSelectDoctotal
                            (local_78,&pSelect,(sqlite3_int64 *)&nPhrase,(char **)0x0);
          *local_b8.aMatchinfo = nPhrase;
          iVar3 = iVar4;
        }
        else {
LAB_001adcf7:
          iVar4 = local_d0;
          iVar3 = 0;
        }
        break;
      case 0x70:
        uVar12 = local_b8.nPhrase;
joined_r0x001add07:
        iVar4 = local_d0;
        iVar3 = 0;
        if ((char)local_cc == '\0') {
          *(uint *)__dest = uVar12;
          iVar3 = 0;
        }
        break;
      case 0x73:
        local_d0 = fts3ExprLoadDoclists(pCsr_00,(int *)0x0,(int *)0x0);
        iVar4 = local_d0;
        iVar3 = local_d0;
        if (local_d0 == 0) {
          __s = (LcsIterator *)sqlite3_malloc64((long)pCsr_00->nPhrase << 5);
          iVar4 = 7;
          iVar3 = 7;
          if (__s != (LcsIterator *)0x0) {
            uVar16 = 0;
            memset(__s,0,(long)pCsr_00->nPhrase << 5);
            fts3ExprIterate(pCsr_00->pExpr,fts3MatchinfoLcsCb,__s);
            uVar10 = (ulong)(uint)local_b8.nPhrase;
            if (local_b8.nPhrase < 1) {
              uVar10 = uVar16;
            }
            iVar3 = 0;
            for (; uVar10 * 0x20 != uVar16; uVar16 = uVar16 + 0x20) {
              iVar3 = iVar3 - *(int *)(*(long *)(*(long *)((long)&__s->pExpr + uVar16) + 0x20) +
                                      0x50);
              *(int *)((long)&__s->iPosOffset + uVar16) = iVar3;
            }
            local_48 = &__s->pRead;
            lVar19 = 0;
            while (lVar19 < local_b8.nCol) {
              iVar3 = 0;
              ppOut = local_48;
              local_58 = lVar19;
              for (lVar20 = 0; __s2 = local_90, lVar20 < local_b8.nPhrase; lVar20 = lVar20 + 1) {
                iVar4 = sqlite3Fts3EvalPhrasePoslist
                                  (pCsr_00,((LcsIterator *)(ppOut + -2))->pExpr,(int)local_58,ppOut)
                ;
                __s2 = local_90;
                if (iVar4 != 0) goto LAB_001adfe6;
                if (*ppOut != (char *)0x0) {
                  *(int *)(ppOut + 1) = *(int *)(ppOut + -1);
                  fts3LcsIteratorAdvance((LcsIterator *)(ppOut + -2));
                  if (*ppOut == (char *)0x0) {
                    iVar4 = 0x10b;
                    __s2 = local_90;
                    goto LAB_001adfe6;
                  }
                  iVar3 = iVar3 + 1;
                }
                ppOut = ppOut + 4;
              }
              iVar4 = 0;
              for (; 0 < iVar3; iVar3 = iVar3 - iVar5) {
                pIter_00 = (LcsIterator *)0x0;
                pLVar11 = (LcsIterator *)(ulong)(uint)local_b8.nPhrase;
                if (local_b8.nPhrase < 1) {
                  pLVar11 = pIter_00;
                }
                iVar5 = 0;
                pLVar13 = __s;
                while (bVar21 = pLVar11 != (LcsIterator *)0x0,
                      pLVar11 = (LcsIterator *)&pLVar11[-1].field_0x1f, bVar21) {
                  if (pLVar13->pRead == (char *)0x0) {
                    iVar5 = 0;
                  }
                  else {
                    if ((pIter_00 == (LcsIterator *)0x0) || (pLVar13->iPos < pIter_00->iPos)) {
                      pIter_00 = pLVar13;
                    }
                    if ((iVar5 == 0) || (iVar14 = 1, pLVar13->iPos == pLVar13[-1].iPos)) {
                      iVar14 = iVar5 + 1;
                    }
                    iVar5 = iVar14;
                    if (iVar4 < iVar14) {
                      iVar4 = iVar14;
                    }
                  }
                  pLVar13 = pLVar13 + 1;
                }
                iVar5 = fts3LcsIteratorAdvance(pIter_00);
              }
              *(int *)((long)local_b8.aMatchinfo + local_58 * 4) = iVar4;
              lVar19 = local_58 + 1;
            }
            iVar4 = 0;
LAB_001adfe6:
            sqlite3_free(__s);
            iVar3 = iVar4;
          }
        }
        break;
      default:
        if (bVar1 == 0x61) {
          if ((char)local_cc != '\0') goto LAB_001adcf7;
          iVar3 = fts3MatchinfoSelectDoctotal(local_78,&pSelect,(sqlite3_int64 *)&nPhrase,&a);
          psVar17 = _nPhrase;
          __s2 = local_90;
          iVar4 = iVar3;
          if (iVar3 == 0) {
            lVar19 = (long)_nPhrase / 2;
            local_d0 = iVar3;
            for (lVar20 = 0; __s2 = local_90, iVar4 = local_d0, lVar20 < local_b8.nCol;
                lVar20 = lVar20 + 1) {
              iVar4 = sqlite3Fts3GetVarint(a,&nToken);
              a = a + iVar4;
              *(int *)((long)local_b8.aMatchinfo + lVar20 * 4) =
                   (int)((long)((ulong)(uint)nToken + lVar19) / (long)psVar17);
            }
          }
        }
        else {
          if (bVar1 != 0x62) {
            uVar12 = local_b8.nCol;
            if (bVar1 == 99) goto joined_r0x001add07;
            if (bVar1 != 0x79) goto switchD_001adba4_caseD_6d;
          }
          sVar7 = fts3MatchinfoSize(&local_b8,bVar1);
          memset(__dest,0,sVar7 * 4);
          iVar4 = fts3ExprLHitGather(pCsr_00->pExpr,&local_b8);
          iVar3 = iVar4;
        }
      }
      local_d0 = iVar4;
      pFVar2 = local_c0;
      sVar7 = fts3MatchinfoSize(&local_b8,__s2[(long)local_c0]);
      __dest = (u8 *)((long)local_b8.aMatchinfo + sVar7 * 4);
      local_c0 = (Fts3Cursor *)((long)&(pFVar2->base).pVtab + 1);
    }
    sqlite3_reset(pSelect);
    if ((char)local_cc == '\0') {
      pMVar9 = pCsr_00->pMIBuffer;
      pMVar9->bGlobal = 1;
      memcpy(pMVar9[1].aRef + (long)pMVar9->nElem * 4,&pMVar9->field_0x1c,(long)pMVar9->nElem << 2);
    }
    p_Var15 = local_60;
    if (iVar3 == 0) {
      sqlite3_result_blob(local_80,local_88,pCsr_00->pMIBuffer->nElem << 2,local_60);
      goto LAB_001ae09e;
    }
  }
  sqlite3_result_error_code(local_80,iVar3);
  if (p_Var15 != (_func_void_void_ptr *)0x0) {
    (*p_Var15)(local_88);
  }
LAB_001ae09e:
  sqlite3Fts3SegmentsClose(local_70);
  return;
}

Assistant:

static void fts3MatchinfoFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  assert( nVal==1 || nVal==2 );
  if( SQLITE_OK==fts3FunctionArg(pContext, "matchinfo", apVal[0], &pCsr) ){
    const char *zArg = 0;
    if( nVal>1 ){
      zArg = (const char *)sqlite3_value_text(apVal[1]);
    }
    sqlite3Fts3Matchinfo(pContext, pCsr, zArg);
  }
}